

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hblas2.cxx
# Opt level: O2

void HBLAS2::hblas2_gemv_square_LDSame<HAXX::quaternion<double>,std::complex<double>,(char)84>(void)

{
  quaternion<double> ALPHA_00;
  complex<double> BETA_00;
  ostream *poVar1;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  long lVar3;
  long lVar4;
  quaternion<double> *x;
  pointer pqVar5;
  pointer pqVar6;
  result_type_conflict1 in_XMM0_Qa;
  result_type_conflict1 rVar7;
  undefined1 auVar8 [16];
  result_type_conflict1 in_XMM1_Qa;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined4 in_stack_fffffffffffffc5c;
  quaternion<double> *in_stack_fffffffffffffc60;
  int32_t INCY;
  result_type_conflict1 in_stack_fffffffffffffc68;
  complex<double> BETA;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> Y;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> X;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> A;
  quaternion<double> local_328;
  quaternion<double> local_308;
  undefined1 local_2e8 [8];
  undefined8 local_2e0;
  shared_count sStack_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> YC;
  undefined **local_278;
  undefined1 local_270;
  undefined8 *local_268;
  char **local_260;
  quaternion<double> __r;
  quaternion<double> ALPHA;
  double local_218;
  double dStack_210;
  double dStack_208;
  double dStack_200;
  quaternion<double> local_1f8;
  quaternion<double> local_1d8;
  stringstream ss;
  ostream local_1a8 [376];
  
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (&A,10000,(allocator_type *)&ss);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (&X,100,(allocator_type *)&ss);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (&Y,100,(allocator_type *)&ss);
  for (pqVar6 = X.
                super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pqVar5 = Y.
               super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      pqVar6 != X.
                super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pqVar6 = pqVar6 + 1) {
    in_XMM1_Qa = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    rVar7 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    in_stack_fffffffffffffc68 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    in_XMM0_Qa = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    pqVar6->_M_real = in_XMM1_Qa;
    pqVar6->_M_imag_i = rVar7;
    pqVar6->_M_imag_j = in_stack_fffffffffffffc68;
    pqVar6->_M_imag_k = in_XMM0_Qa;
  }
  for (; pqVar6 = A.
                  super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
      pqVar5 != Y.
                super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pqVar5 = pqVar5 + 1) {
    in_XMM1_Qa = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    rVar7 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    in_stack_fffffffffffffc68 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    in_XMM0_Qa = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    pqVar5->_M_real = in_XMM1_Qa;
    pqVar5->_M_imag_i = rVar7;
    pqVar5->_M_imag_j = in_stack_fffffffffffffc68;
    pqVar5->_M_imag_k = in_XMM0_Qa;
  }
  for (; INCY = SUB84(in_stack_fffffffffffffc68,0),
      pqVar6 != A.
                super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pqVar6 = pqVar6 + 1) {
    in_XMM1_Qa = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    rVar7 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    in_stack_fffffffffffffc68 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    in_XMM0_Qa = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    pqVar6->_M_real = in_XMM1_Qa;
    pqVar6->_M_imag_i = rVar7;
    pqVar6->_M_imag_j = in_stack_fffffffffffffc68;
    pqVar6->_M_imag_k = in_XMM0_Qa;
  }
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector(&YC,&Y);
  genRandom<HAXX::quaternion<double>>();
  genRandom<std::complex<double>>();
  BETA._M_value._0_8_ = in_XMM0_Qa;
  BETA._M_value._8_8_ = in_XMM1_Qa;
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar1 = std::operator<<(local_1a8,"hblas2_gemv_square_");
  std::operator<<(poVar1,'T');
  std::operator<<(local_1a8,"Q");
  std::operator<<(local_1a8,"C");
  std::operator<<(local_1a8,"_LDSame");
  std::__cxx11::stringbuf::str();
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_328);
  poVar1 = std::operator<<(poVar1," will use");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_328);
  poVar1 = std::operator<<((ostream *)&std::cout,"  ALPHA = ");
  pbVar2 = HAXX::operator<<(poVar1,&ALPHA);
  std::endl<char,std::char_traits<char>>(pbVar2);
  poVar1 = std::operator<<((ostream *)&std::cout,"  BETA = ");
  poVar1 = std::operator<<(poVar1,(complex *)&BETA);
  std::endl<char,std::char_traits<char>>(poVar1);
  ALPHA_00._M_imag_i = ALPHA._M_imag_i;
  ALPHA_00._M_real = ALPHA._M_real;
  ALPHA_00._M_imag_j = ALPHA._M_imag_j;
  ALPHA_00._M_imag_k = ALPHA._M_imag_k;
  BETA_00._M_value._8_4_ = 1;
  BETA_00._M_value._0_8_ =
       Y.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  BETA_00._M_value._12_4_ = in_stack_fffffffffffffc5c;
  HAXX::
  HBLAS_GEMV<double,HAXX::quaternion<double>,HAXX::quaternion<double>,HAXX::quaternion<double>,std::complex<double>>
            ('T',100,100,ALPHA_00,
             A.
             super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start,100,
             X.
             super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start,1,BETA_00,in_stack_fffffffffffffc60,INCY);
  lVar3 = 0;
  for (lVar4 = 0; lVar4 != 320000; lVar4 = lVar4 + 0xc80) {
    local_328._M_real = 0.0;
    local_328._M_imag_i = 0.0;
    local_328._M_imag_j = 0.0;
    local_328._M_imag_k = 0.0;
    HAXX::HBLAS_DOTUV<double>
              (&local_308,100,
               (quaternion<double> *)
               ((long)&(A.
                        super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_real + lVar4),1,
               X.
               super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start,1);
    local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2a0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas2.cxx";
    local_298 = "";
    local_328._M_real = local_308._M_real;
    local_328._M_imag_i = local_308._M_imag_i;
    local_328._M_imag_j = local_308._M_imag_j;
    local_328._M_imag_k = local_308._M_imag_k;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2a0,0x47,&local_2b0);
    HAXX::operator*(&local_1f8,&ALPHA,&local_328);
    HAXX::operator*(&BETA,(quaternion<double> *)
                          ((long)&(YC.
                                   super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_real + lVar3));
    __r._M_real = local_218 + local_1f8._M_real;
    __r._M_imag_i = dStack_210 + local_1f8._M_imag_i;
    __r._M_imag_j = dStack_208 + local_1f8._M_imag_j;
    __r._M_imag_k = dStack_200 + local_1f8._M_imag_k;
    HAXX::inv<double>(&local_1d8,
                      (quaternion<double> *)
                      ((long)&(Y.
                               super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_real + lVar3));
    HAXX::operator*(&local_308,&__r,&local_1d8);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_308._M_imag_i;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_308._M_imag_j;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = local_308._M_imag_k;
    local_270 = 0;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = (local_308._M_real + -1.0) * (local_308._M_real + -1.0);
    auVar8 = vfmadd231sd_fma(auVar11,auVar8,auVar8);
    auVar8 = vfmadd231sd_fma(auVar8,auVar9,auVar9);
    auVar8 = vfmadd231sd_fma(auVar8,auVar10,auVar10);
    auVar8 = vsqrtsd_avx(auVar8,auVar8);
    local_2e8[0] = auVar8._0_8_ < 1e-12;
    local_2e0 = 0;
    sStack_2d8.pi_ = (sp_counted_base *)0x0;
    local_2c0 = "( HAXX::norm(((ALPHA*tmp + BETA*YC[i]) * HAXX::inv(Y[i]))- 1.) < 1e-12 )";
    local_2b8 = "";
    local_278 = &PTR__lazy_ostream_00219908;
    local_268 = &boost::unit_test::lazy_ostream::inst;
    local_260 = &local_2c0;
    local_2d0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas2.cxx";
    local_2c8 = "";
    boost::test_tools::tt_detail::report_assertion(local_2e8,&local_278,&local_2d0,0x47,1,0,0);
    boost::detail::shared_count::~shared_count(&sStack_2d8);
    lVar3 = lVar3 + 0x20;
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::_Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
  ~_Vector_base(&YC.
                 super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               );
  std::_Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
  ~_Vector_base(&Y.
                 super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               );
  std::_Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
  ~_Vector_base(&X.
                 super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               );
  std::_Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
  ~_Vector_base(&A.
                 super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               );
  return;
}

Assistant:

void hblas2_gemv_square_LDSame() {

  // Random Quaternion vectors and matricies
  std::vector<HAXX::quaternion<double>> 
    A(HBLAS2_MATLEN), X(HBLAS1_VECLEN), Y(HBLAS1_VECLEN);

  for(auto &x : X) 
    x = HAXX::quaternion<double>(dis(gen),dis(gen),dis(gen),dis(gen));
  for(auto &x : Y) 
    x = HAXX::quaternion<double>(dis(gen),dis(gen),dis(gen),dis(gen));
  for(auto &x : A) 
    x = HAXX::quaternion<double>(dis(gen),dis(gen),dis(gen),dis(gen));

  std::vector<HAXX::quaternion<double>> YC(Y);

  _AlphaF ALPHA = genRandom<_AlphaF>();
  _BetaF  BETA = genRandom<_BetaF>();

  std::stringstream ss;

  ss << "hblas2_gemv_square_" << _TA;
  if(std::is_same<double,_AlphaF>::value) ss << "R";
  else if(std::is_same<std::complex<double>,_AlphaF>::value) ss << "C";
  else ss << "Q";
  if(std::is_same<double,_BetaF>::value) ss << "R";
  else if(std::is_same<std::complex<double>,_BetaF>::value) ss << "C";
  else ss << "Q";
  ss << "_LDSame";

  std::cout << ss.str() << " will use" << std::endl;
  std::cout << "  ALPHA = " << ALPHA << std::endl;
  std::cout << "  BETA = " << BETA << std::endl;

  HBLAS_GEMV(_TA,HBLAS1_VECLEN,HBLAS1_VECLEN,ALPHA,&A[0],HBLAS1_VECLEN,&X[0],1,
    BETA,&Y[0],1);

  for(int i = 0; i < HBLAS1_VECLEN; i++) {
    HAXX_INT AROW = 0;
    HAXX_INT ACOL = i;
    HAXX_INT AStride = 1;
    if( _TA == 'N' ) {
      AROW = i;
      ACOL = 0;
      AStride = HBLAS1_VECLEN;
    }

    HAXX::quaternion<double> tmp;
    if( _TA == 'C' )
      tmp = HBLAS_DOTCV(HBLAS1_VECLEN,&A[RANK2_INDX(AROW,ACOL,HBLAS1_VECLEN)],
          AStride,&X[0],1);
    else
      tmp = HBLAS_DOTUV(HBLAS1_VECLEN,&A[RANK2_INDX(AROW,ACOL,HBLAS1_VECLEN)],
          AStride,&X[0],1);

    BOOST_CHECK(CMP_Q(ALPHA*tmp + BETA*YC[i],Y[i]));
  }

}